

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.hpp
# Opt level: O2

float * __thiscall openjij::graph::Sparse<float>::h(Sparse<float> *this,Index i)

{
  mapped_type *pmVar1;
  key_type local_10;
  
  if (i < (this->super_Graph)._num_spins) {
    local_10.first = i;
    local_10.second = i;
    pmVar1 = std::__detail::
             _Map_base<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_float>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_float>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_openjij::utility::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_float>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_float>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_openjij::utility::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)&this->_J,&local_10);
    return pmVar1;
  }
  __assert_fail("i < get_num_spins()",
                "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/include/openjij/graph/sparse.hpp"
                ,0x13a,
                "const FloatType &openjij::graph::Sparse<float>::h(Index) const [FloatType = float]"
               );
}

Assistant:

const FloatType &h(Index i) const {
    assert(i < get_num_spins());
    return _J.at(std::make_pair(i, i));
  }